

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_equals(bitset_container_t *container1,bitset_container_t *container2)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = container1->cardinality;
  if ((iVar1 != -1) && (container2->cardinality != -1)) {
    if (iVar1 != container2->cardinality) {
      return false;
    }
    if (iVar1 == 0x10000) {
      return true;
    }
  }
  _Var2 = croaring_avx2();
  if (!_Var2) {
    return true;
  }
  _Var2 = _avx2_bitset_container_equals(container1,container2);
  return _Var2;
}

Assistant:

bool bitset_container_equals(const bitset_container_t *container1, const bitset_container_t *container2) {
	if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
		if(container1->cardinality != container2->cardinality) {
			return false;
		}
    if (container1->cardinality == INT32_C(0x10000)) {
        return true;
    }
	}
#ifdef CROARING_IS_X64
  if( croaring_avx2() ) {
    return _avx2_bitset_container_equals(container1, container2);
  }
#else
  return memcmp(container1->words,
                container2->words,
                BITSET_CONTAINER_SIZE_IN_WORDS*sizeof(uint64_t)) == 0;
#endif
	return true;
}